

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O0

int __thiscall
TPZFMatrix<long>::Substitution(TPZFMatrix<long> *this,TPZFMatrix<long> *B,TPZVec<int> *index)

{
  long lVar1;
  int iVar2;
  ostream *poVar3;
  int64_t iVar4;
  void *this_00;
  long *plVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TPZVec<int> *in_RDX;
  TPZBaseMatrix *in_RSI;
  TPZBaseMatrix *in_RDI;
  TPZVec<long> v;
  long sum;
  int64_t j;
  int64_t i;
  int64_t ic;
  int64_t ncols;
  int nRows;
  TPZFMatrix<long> *b;
  _func_int **in_stack_fffffffffffffec8;
  TPZVec<long> *in_stack_fffffffffffffed0;
  long in_stack_fffffffffffffee0;
  long *in_stack_fffffffffffffee8;
  TPZFMatrix<long> *in_stack_fffffffffffffef0;
  TPZVec<long> local_78;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  int local_2c;
  TPZBaseMatrix *local_28;
  TPZVec<int> *local_20;
  TPZBaseMatrix *local_18;
  
  if (in_RSI == (TPZBaseMatrix *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                            );
    poVar3 = std::operator<<(poVar3,"TPZFMatrix<>*B eh nulo");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else if (in_RDI->fDecomposed == '\0') {
    poVar3 = std::operator<<((ostream *)&std::cerr,
                             "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                            );
    poVar3 = std::operator<<(poVar3,anon_var_dwarf_266cb9);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    local_28 = in_RSI;
    local_20 = in_RDX;
    local_18 = in_RSI;
    if (in_RDI->fDecomposed != '\x02') {
      poVar3 = std::operator<<((ostream *)&std::cerr,
                               "virtual int TPZFMatrix<long>::Substitution(TPZFMatrix<TVar> *, const TPZVec<int> &) const [TVar = long]"
                              );
      poVar3 = std::operator<<(poVar3,"\nfDecomposed != ELUPivot");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    iVar4 = TPZBaseMatrix::Rows(in_RDI);
    local_2c = (int)iVar4;
    iVar4 = TPZVec<int>::NElements(local_20);
    if ((iVar4 == local_2c) && (iVar4 = TPZBaseMatrix::Rows(local_28), iVar4 == local_2c)) {
      local_38 = TPZBaseMatrix::Cols(local_18);
      for (local_40 = 0; local_40 < local_38; local_40 = local_40 + 1) {
        local_58 = 0;
        TPZVec<long>::TPZVec(in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8);
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          TPZVec<int>::operator[](local_20,local_48);
          plVar5 = operator()(in_stack_fffffffffffffef0,(int64_t)in_stack_fffffffffffffee8,
                              in_stack_fffffffffffffee0);
          lVar1 = *plVar5;
          plVar5 = TPZVec<long>::operator[](&local_78,local_48);
          *plVar5 = lVar1;
        }
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          local_58 = 0;
          for (local_50 = 0; lVar1 = local_58, local_50 < local_48; local_50 = local_50 + 1) {
            iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48,local_50);
            plVar5 = TPZVec<long>::operator[](&local_78,local_50);
            local_58 = CONCAT44(extraout_var,iVar2) * *plVar5 + local_58;
          }
          plVar5 = TPZVec<long>::operator[](&local_78,local_48);
          *plVar5 = *plVar5 - lVar1;
        }
        for (local_48 = (long)(local_2c + -1); -1 < local_48; local_48 = local_48 + -1) {
          local_58 = 0;
          local_50 = local_48;
          while (local_50 = local_50 + 1, local_50 < local_2c) {
            iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48,local_50);
            plVar5 = TPZVec<long>::operator[](&local_78,local_50);
            local_58 = CONCAT44(extraout_var_00,iVar2) * *plVar5 + local_58;
          }
          plVar5 = TPZVec<long>::operator[](&local_78,local_48);
          in_stack_fffffffffffffef0 = (TPZFMatrix<long> *)(*plVar5 - local_58);
          iVar2 = (*(in_RDI->super_TPZSavable)._vptr_TPZSavable[0x21])(in_RDI,local_48);
          in_stack_fffffffffffffee0 =
               (long)in_stack_fffffffffffffef0 / CONCAT44(extraout_var_01,iVar2);
          in_stack_fffffffffffffee8 = TPZVec<long>::operator[](&local_78,local_48);
          *in_stack_fffffffffffffee8 = in_stack_fffffffffffffee0;
        }
        for (local_48 = 0; local_48 < local_2c; local_48 = local_48 + 1) {
          plVar5 = TPZVec<long>::operator[](&local_78,local_48);
          in_stack_fffffffffffffec8 = (_func_int **)*plVar5;
          in_stack_fffffffffffffed0 =
               (TPZVec<long> *)
               operator()(in_stack_fffffffffffffef0,(int64_t)in_stack_fffffffffffffee8,
                          in_stack_fffffffffffffee0);
          in_stack_fffffffffffffed0->_vptr_TPZVec = in_stack_fffffffffffffec8;
        }
        TPZVec<long>::~TPZVec(in_stack_fffffffffffffed0);
      }
      return 1;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_266cdb);
    poVar3 = std::operator<<(poVar3,"this->fIndex = ");
    iVar4 = TPZVec<int>::NElements(local_20);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar4);
    poVar3 = std::operator<<(poVar3,"  b = ");
    iVar4 = TPZBaseMatrix::Rows(local_28);
    this_00 = (void *)std::ostream::operator<<(poVar3,iVar4);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int TPZFMatrix<TVar>::Substitution( TPZFMatrix<TVar> *B, const TPZVec<int> &index ) const{
    
    if(!B){
        PZError << __PRETTY_FUNCTION__ << "TPZFMatrix<>*B eh nulo" << endl;
        return 0;
    }
    
    TPZFMatrix<TVar> &b = *B;
    
    if (!this->fDecomposed){
        PZError <<  __PRETTY_FUNCTION__ << "Matriz não decomposta" << endl;
        return 0;
    }
    
    if (this->fDecomposed != ELUPivot){
        PZError << __PRETTY_FUNCTION__ << "\nfDecomposed != ELUPivot" << endl;
    }
    
    int nRows = this->Rows();
    
    if (index.NElements() != nRows || b.Rows() != nRows)
    {
        cout << "TMatrix::Substituicao ERRO : vetores com dimensões incompativeis:\n"
        << "this->fIndex = " << index.NElements() << "  b = " << b.Rows() << endl;
        return 0;
    }
    
    int64_t ncols = B->Cols();
    for(int64_t ic = 0; ic<ncols; ic++)
    {
        int64_t i,j;
        TVar sum = 0;
        
        TPZVec<TVar> v(nRows);
        
        
        for (i=0;i<nRows;i++)
        {
            v[i] = b(index[i],ic);
        }
        
        //Ly=b
        for (i=0;i<nRows;i++)
        {
            sum = 0.;
            for (j=0;j<(i);j++) sum +=this->Get(i,j) * v[j];
            v[i] -= sum;
        }
        
        //Ux=y
        for (i=(nRows-1);i>-1;i--)
        {
            sum = 0.;
            for (j=(i+1);j<nRows;j++) sum += this->Get(i,j) * v[j];
            v[i] = (v[i] - sum) / this->Get(i,i);
        }
        
        for (i=0;i<nRows;i++) b(i,ic) = v[i];
    }
    return 1;
}